

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  Nonnull<char_*> pcVar2;
  size_t in_R9;
  ulong uVar3;
  string_view format;
  ulong local_88;
  long local_80;
  long local_78;
  Nonnull<char_*> local_70;
  ulong local_68;
  long local_60;
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
  lVar1 = *(long *)(**(long **)this + 8);
  uVar3 = (ulong)*(ushort *)(lVar1 + 2);
  pcVar2 = numbers_internal::FastIntToBuffer(*(int32_t *)(**(long **)this + 4),local_48);
  local_78 = (long)pcVar2 - (long)local_48;
  local_60 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  local_68 = (ulong)*(ushort *)(local_60 + 2);
  local_60 = ~local_68 + local_60;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_88;
  format._M_len =
       (size_t)
       "Missing extension declaration for field $0 with number $1 in extendee message $2. An extension range must declare for all extension fields if its verification state is DECLARATION or there\'s any declaration in the range already. Otherwise, consider splitting up the range."
  ;
  local_88 = uVar3;
  local_80 = ~uVar3 + lVar1;
  local_70 = local_48;
  local_58 = local_78;
  local_50 = local_48;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x110,format,
             (Nullable<const_absl::string_view_*>)0x3,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}